

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O1

int __thiscall CVmDynamicFunc::get_invoker(CVmDynamicFunc *this,vm_val_t *val)

{
  int iVar1;
  char *pcVar2;
  
  if (val != (vm_val_t *)0x0) {
    pcVar2 = (this->super_CVmObject).ext_;
    iVar1 = *(int *)(pcVar2 + 0x28);
    val->typ = VM_CODEPTR;
    (val->val).ptr = pcVar2 + (long)iVar1 * 4 + 0x30;
  }
  return 1;
}

Assistant:

int CVmDynamicFunc::get_invoker(VMG_ vm_val_t *val)
{
    /* 
     *   Return a pointer to the start of our byte code.  The actual method
     *   header starts after our prefix.  
     */
    if (val != 0)
        val->set_codeptr(get_ext()->get_bytecode_ptr());

    /* we're invokable */
    return TRUE;
}